

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

CBlockIndex * __thiscall Chainstate::FindMostWorkChain(Chainstate *this)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  ChainstateManager *pCVar4;
  CBlockIndex *pCVar5;
  _Rb_tree_header *p_Var6;
  long in_FS_OFFSET;
  pair<CBlockIndex_*,_CBlockIndex_*> local_58;
  CBlockIndex *local_48;
  CBlockIndex *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var6 = &(this->setBlockIndexCandidates)._M_t._M_impl.super__Rb_tree_header;
  do {
    if (p_Var6 == (_Rb_tree_header *)
                  (this->setBlockIndexCandidates)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left) {
      pCVar5 = (CBlockIndex *)0x0;
LAB_008b3d0c:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return pCVar5;
      }
      __stack_chk_fail();
    }
    lVar3 = std::_Rb_tree_decrement(&p_Var6->_M_header);
    pCVar5 = *(CBlockIndex **)(lVar3 + 0x20);
    local_40 = pCVar5;
    while( true ) {
      if (local_40 == (CBlockIndex *)0x0) goto LAB_008b3d0c;
      bVar2 = CChain::Contains(&this->m_chain,local_40);
      if (bVar2) goto LAB_008b3d0c;
      if ((local_40->m_chain_tx_count == 0) && (local_40->nHeight != 0)) {
        __assert_fail("pindexTest->HaveNumChainTxs() || pindexTest->nHeight == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0xcb2,"CBlockIndex *Chainstate::FindMostWorkChain()");
      }
      uVar1 = local_40->nStatus;
      if ((uVar1 & 0x68) != 8) break;
      local_40 = local_40->pprev;
    }
    if ((uVar1 & 0x60) != 0) {
      pCVar4 = this->m_chainman;
      if (pCVar4->m_best_invalid != (CBlockIndex *)0x0) {
        bVar2 = operator>(&(pCVar5->nChainWork).super_base_uint<256U>,
                          &(pCVar4->m_best_invalid->nChainWork).super_base_uint<256U>);
        if (!bVar2) goto LAB_008b3ce7;
        pCVar4 = this->m_chainman;
      }
      pCVar4->m_best_invalid = pCVar5;
    }
LAB_008b3ce7:
    while (local_48 = pCVar5, local_40 != pCVar5) {
      if ((uVar1 & 0x60) == 0) {
        if ((uVar1 & 8) == 0) {
          local_58.first = pCVar5->pprev;
          local_58.second = pCVar5;
          std::
          _Rb_tree<CBlockIndex*,std::pair<CBlockIndex*const,CBlockIndex*>,std::_Select1st<std::pair<CBlockIndex*const,CBlockIndex*>>,std::less<CBlockIndex*>,std::allocator<std::pair<CBlockIndex*const,CBlockIndex*>>>
          ::_M_emplace_equal<std::pair<CBlockIndex*,CBlockIndex*>>
                    ((_Rb_tree<CBlockIndex*,std::pair<CBlockIndex*const,CBlockIndex*>,std::_Select1st<std::pair<CBlockIndex*const,CBlockIndex*>>,std::less<CBlockIndex*>,std::allocator<std::pair<CBlockIndex*const,CBlockIndex*>>>
                      *)&this->m_blockman->m_blocks_unlinked,&local_58);
        }
      }
      else {
        *(byte *)&pCVar5->nStatus = (byte)pCVar5->nStatus | 0x40;
        std::
        _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
        ::_M_insert_unique<CBlockIndex*const&>
                  ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                    *)&this->m_blockman->m_dirty_blockindex,&local_48);
      }
      std::
      _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
      ::erase(&(this->setBlockIndexCandidates)._M_t,&local_48);
      pCVar5 = local_48->pprev;
    }
    std::
    _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
    ::erase(&(this->setBlockIndexCandidates)._M_t,&local_40);
  } while( true );
}

Assistant:

CBlockIndex* Chainstate::FindMostWorkChain()
{
    AssertLockHeld(::cs_main);
    do {
        CBlockIndex *pindexNew = nullptr;

        // Find the best candidate header.
        {
            std::set<CBlockIndex*, CBlockIndexWorkComparator>::reverse_iterator it = setBlockIndexCandidates.rbegin();
            if (it == setBlockIndexCandidates.rend())
                return nullptr;
            pindexNew = *it;
        }

        // Check whether all blocks on the path between the currently active chain and the candidate are valid.
        // Just going until the active chain is an optimization, as we know all blocks in it are valid already.
        CBlockIndex *pindexTest = pindexNew;
        bool fInvalidAncestor = false;
        while (pindexTest && !m_chain.Contains(pindexTest)) {
            assert(pindexTest->HaveNumChainTxs() || pindexTest->nHeight == 0);

            // Pruned nodes may have entries in setBlockIndexCandidates for
            // which block files have been deleted.  Remove those as candidates
            // for the most work chain if we come across them; we can't switch
            // to a chain unless we have all the non-active-chain parent blocks.
            bool fFailedChain = pindexTest->nStatus & BLOCK_FAILED_MASK;
            bool fMissingData = !(pindexTest->nStatus & BLOCK_HAVE_DATA);
            if (fFailedChain || fMissingData) {
                // Candidate chain is not usable (either invalid or missing data)
                if (fFailedChain && (m_chainman.m_best_invalid == nullptr || pindexNew->nChainWork > m_chainman.m_best_invalid->nChainWork)) {
                    m_chainman.m_best_invalid = pindexNew;
                }
                CBlockIndex *pindexFailed = pindexNew;
                // Remove the entire chain from the set.
                while (pindexTest != pindexFailed) {
                    if (fFailedChain) {
                        pindexFailed->nStatus |= BLOCK_FAILED_CHILD;
                        m_blockman.m_dirty_blockindex.insert(pindexFailed);
                    } else if (fMissingData) {
                        // If we're missing data, then add back to m_blocks_unlinked,
                        // so that if the block arrives in the future we can try adding
                        // to setBlockIndexCandidates again.
                        m_blockman.m_blocks_unlinked.insert(
                            std::make_pair(pindexFailed->pprev, pindexFailed));
                    }
                    setBlockIndexCandidates.erase(pindexFailed);
                    pindexFailed = pindexFailed->pprev;
                }
                setBlockIndexCandidates.erase(pindexTest);
                fInvalidAncestor = true;
                break;
            }
            pindexTest = pindexTest->pprev;
        }
        if (!fInvalidAncestor)
            return pindexNew;
    } while(true);
}